

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void CleanNode(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  AttVal *local_30;
  AttVal *id;
  Node *next;
  Node *child;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (node->content != (Node *)0x0) {
    next = node->content;
    child = node;
    node_local = &doc->root;
    while (next != (Node *)0x0) {
      id = (AttVal *)next->next;
      BVar1 = prvTidynodeIsElement(next);
      if (BVar1 != no) {
        if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) &&
           (next->tag->id == TidyTag_STYLE)) {
          prvTidyDiscardElement((TidyDocImpl *)node_local,next);
        }
        if (((next == (Node *)0x0) || (next->tag == (Dict *)0x0)) ||
           ((next->tag->id != TidyTag_P || (next->content != (Node *)0x0)))) {
          if (((next == (Node *)0x0) || (next->tag == (Dict *)0x0)) ||
             (next->tag->id != TidyTag_SPAN)) {
            if ((((next == (Node *)0x0) || (next->tag == (Dict *)0x0)) ||
                (next->tag->id != TidyTag_A)) || (next->content != (Node *)0x0)) {
              if (next->attributes != (AttVal *)0x0) {
                prvTidyDropAttrByName((TidyDocImpl *)node_local,next,"class");
              }
              CleanNode((TidyDocImpl *)node_local,next);
            }
            else {
              local_30 = prvTidyGetAttrByName(next,"name");
              if (local_30 == (AttVal *)0x0) {
                local_30 = prvTidyGetAttrByName(next,anon_var_dwarf_40232 + 0x2b);
              }
              if (local_30 != (AttVal *)0x0) {
                prvTidyRepairAttrValue
                          ((TidyDocImpl *)node_local,next->parent,anon_var_dwarf_40232 + 0x2b,
                           local_30->value);
              }
              prvTidyDiscardElement((TidyDocImpl *)node_local,next);
            }
          }
          else {
            DiscardContainer((TidyDocImpl *)node_local,next,(Node **)&id);
          }
        }
        else {
          prvTidyDiscardElement((TidyDocImpl *)node_local,next);
        }
      }
      next = (Node *)id;
    }
  }
  return;
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}